

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

size_t Map_EnumObjects(PCASC_MAP pMap,void **ppvArray)

{
  size_t sVar1;
  long lVar2;
  size_t i;
  size_t sVar3;
  
  if (ppvArray != (void **)0x0 && pMap != (PCASC_MAP)0x0) {
    sVar1 = pMap->TableSize;
    lVar2 = 0;
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      if (pMap->HashTable[sVar3] != (void *)0x0) {
        ppvArray[lVar2] = pMap->HashTable[sVar3];
        lVar2 = lVar2 + 1;
      }
    }
    return pMap->ItemCount;
  }
  return 0;
}

Assistant:

size_t Map_EnumObjects(PCASC_MAP pMap, void **ppvArray)
{
    size_t nIndex = 0;

    // Verify pointer to the map
    if(pMap != NULL && ppvArray != NULL)
    {
        // Enumerate all items in main table
        for(size_t i = 0; i < pMap->TableSize; i++)
        {
            // Is that cell valid?
            if(pMap->HashTable[i] != NULL)
            {
                ppvArray[nIndex++] = pMap->HashTable[i];
            }
        }

        return pMap->ItemCount;
    }

    return 0;
}